

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algorithms.h
# Opt level: O3

filtration_algorithm_t * get_custom_filtration_computer(string *algorithm)

{
  int iVar1;
  filtration_algorithm_t *pfVar2;
  undefined **ppuVar3;
  
  iVar1 = std::__cxx11::string::compare((char *)algorithm);
  if (iVar1 == 0) {
    ppuVar3 = &PTR__filtration_algorithm_t_001512d0;
  }
  else {
    iVar1 = std::__cxx11::string::compare((char *)algorithm);
    if (iVar1 == 0) {
      ppuVar3 = &PTR__filtration_algorithm_t_00151338;
    }
    else {
      iVar1 = std::__cxx11::string::compare((char *)algorithm);
      if (iVar1 == 0) {
        ppuVar3 = &PTR__filtration_algorithm_t_00151390;
      }
      else {
        iVar1 = std::__cxx11::string::compare((char *)algorithm);
        if (iVar1 == 0) {
          ppuVar3 = &PTR__filtration_algorithm_t_001513e8;
        }
        else {
          iVar1 = std::__cxx11::string::compare((char *)algorithm);
          if (iVar1 == 0) {
            ppuVar3 = &PTR__filtration_algorithm_t_00151440;
          }
          else {
            iVar1 = std::__cxx11::string::compare((char *)algorithm);
            if (iVar1 == 0) {
              ppuVar3 = &PTR__filtration_algorithm_t_00151498;
            }
            else {
              iVar1 = std::__cxx11::string::compare((char *)algorithm);
              if (iVar1 == 0) {
                ppuVar3 = &PTR__filtration_algorithm_t_001514f0;
              }
              else {
                iVar1 = std::__cxx11::string::compare((char *)algorithm);
                if (iVar1 == 0) {
                  ppuVar3 = &PTR__filtration_algorithm_t_00151548;
                }
                else {
                  iVar1 = std::__cxx11::string::compare((char *)algorithm);
                  if (iVar1 == 0) {
                    ppuVar3 = &PTR__filtration_algorithm_t_001515a0;
                  }
                  else {
                    iVar1 = std::__cxx11::string::compare((char *)algorithm);
                    if (iVar1 == 0) {
                      ppuVar3 = &PTR__filtration_algorithm_t_001515f8;
                    }
                    else {
                      iVar1 = std::__cxx11::string::compare((char *)algorithm);
                      if (iVar1 != 0) {
                        return (filtration_algorithm_t *)0x0;
                      }
                      ppuVar3 = &PTR__filtration_algorithm_t_00151650;
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  pfVar2 = (filtration_algorithm_t *)operator_new(8);
  pfVar2->_vptr_filtration_algorithm_t = (_func_int **)ppuVar3;
  return pfVar2;
}

Assistant:

filtration_algorithm_t* get_custom_filtration_computer(std::string algorithm) {
	if (algorithm == "dimension") return new dimension_filtration();
	if (algorithm == "zero") return new zero_filtration();
	if (algorithm == "max") return new max_filtration();
	if (algorithm == "max3") return new max3_filtration();
	if (algorithm == "max_plus_one") return new max_plus_one_filtration();
	if (algorithm == "product") return new product_filtration();
	if (algorithm == "sum") return new sum_filtration();
	if (algorithm == "pmean") return new pmean_filtration();
	if (algorithm == "pmoment") return new pmoment_filtration();
	if (algorithm == "remove_edges") return new remove_edges_filtration();
	if (algorithm == "vertex_degree") return new vertex_degree_filtration();

	return nullptr;
}